

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  string *name;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  string *arg;
  pointer pbVar5;
  pointer lff_00;
  string oldDef;
  cmExecutionStatus local_6c;
  pointer local_68;
  undefined1 local_60 [16];
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  undefined1 local_40;
  
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "foreach");
  if (bVar2) {
    this->Depth = this->Depth + 1;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff
                            ,"endforeach");
    if (bVar2) {
      if (this->Depth == 0) {
        local_60._8_8_ = inStatus;
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_60,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar2 = (_Map_pointer)local_60._0_8_ != (_Map_pointer)0x0;
        if (!bVar2) {
          return bVar2;
        }
        local_50 = (_Elt_pointer)&local_40;
        local_48 = (_Elt_pointer)0x0;
        local_40 = 0;
        pcVar4 = cmMakefile::GetDefinition
                           (mf,(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        if (pcVar4 != (char *)0x0) {
          cmMakefile::GetDefinition
                    (mf,(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::assign((char *)&local_50);
        }
        pbVar5 = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_68 = (this->Args).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        do {
          pbVar5 = pbVar5 + 1;
          name = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          if (pbVar5 == local_68) {
            cmMakefile::AddDefinition(mf,name,(char *)local_50);
LAB_001dcaca:
            std::__cxx11::string::~string((string *)&local_50);
            if ((_Map_pointer)local_60._0_8_ == (_Map_pointer)0x0) {
              return bVar2;
            }
            (*(code *)(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         **)local_60._0_8_)[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)();
            return bVar2;
          }
          cmMakefile::AddDefinition(mf,name,(pbVar5->_M_dataplus)._M_p);
          lff_00 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar1 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          while (lff_00 != pcVar1) {
            local_6c.ReturnInvoked = false;
            local_6c.BreakInvoked = false;
            local_6c.ContinueInvoked = false;
            local_6c.NestedError = false;
            cmMakefile::ExecuteCommand(mf,lff_00,&local_6c);
            if (local_6c.ReturnInvoked == true) {
              *(bool *)local_60._8_8_ = true;
LAB_001dcab9:
              cmMakefile::AddDefinition
                        (mf,(this->Args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(char *)local_50);
              goto LAB_001dcaca;
            }
            if (local_6c.BreakInvoked != false) goto LAB_001dcab9;
            if (local_6c.ContinueInvoked != false) break;
            bVar3 = cmSystemTools::GetFatalErrorOccured();
            lff_00 = lff_00 + 1;
            if (bVar3) goto LAB_001dcaca;
          }
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                                 cmMakefile& mf,
                                                 cmExecutionStatus& inStatus)
{
  if (lff.Name.Lower == "foreach") {
    // record the number of nested foreach commands
    this->Depth++;
  } else if (lff.Name.Lower == "endforeach") {
    // if this is the endofreach for this statement
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0])) {
        oldDef = mf.GetDefinition(this->Args[0]);
      }

      for (std::string const& arg : cmMakeRange(this->Args).advance(1)) {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0], arg.c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for (cmListFileFunction const& func : this->Functions) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetBreakInvoked()) {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
      }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0], oldDef.c_str());
      return true;
    }
    // close out a nested foreach
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}